

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

PsbtScriptDataStruct * __thiscall
cfd::api::json::PsbtScriptData::ConvertToStruct
          (PsbtScriptDataStruct *__return_storage_ptr__,PsbtScriptData *this)

{
  _Rb_tree_header *p_Var1;
  
  (__return_storage_ptr__->asm_)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->asm_).field_2
  ;
  (__return_storage_ptr__->asm_)._M_string_length = 0;
  (__return_storage_ptr__->asm_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->type)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->type).field_2
  ;
  (__return_storage_ptr__->type)._M_string_length = 0;
  (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->hex);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->type);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtScriptDataStruct PsbtScriptData::ConvertToStruct() const {  // NOLINT
  PsbtScriptDataStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.type = type_;
  result.ignore_items = ignore_items;
  return result;
}